

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void slang::ast::PortSymbol::fromSyntax
               (PortListSyntax *syntax,Scope *scope,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_>
               *implicitMembers,
               span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
               portDeclarations)

{
  bool bVar1;
  undefined1 uVar2;
  AnsiPortListSyntax *pAVar3;
  ExplicitNonAnsiPortSyntax *syntax_00;
  ImplicitNonAnsiPortSyntax *syntax_01;
  NonAnsiPortListBuilder *in_RDX;
  NonAnsiPortListBuilder *this;
  SyntaxNode *in_RDI;
  const_iterator cVar4;
  SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *in_stack_00000040;
  Scope *in_stack_00000048;
  NonAnsiPortListBuilder *in_stack_00000050;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  in_stack_00000058;
  NonAnsiPortSyntax *port_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *__range3_1;
  NonAnsiPortListBuilder builder_1;
  MemberSyntax *port;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *__range3;
  AnsiPortListBuilder builder;
  iterator_base<const_slang::syntax::MemberSyntax_*> *in_stack_fffffffffffffae8;
  Symbol *in_stack_fffffffffffffaf0;
  Scope *in_stack_fffffffffffffaf8;
  AnsiPortListBuilder *in_stack_fffffffffffffb00;
  Symbol *in_stack_fffffffffffffb08;
  NonAnsiPortListBuilder *in_stack_fffffffffffffb10;
  SyntaxNode *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb38;
  SyntaxKind SVar5;
  undefined7 in_stack_fffffffffffffb48;
  ExplicitAnsiPortSyntax *in_stack_fffffffffffffb58;
  AnsiPortListBuilder *in_stack_fffffffffffffb60;
  Scope *in_stack_fffffffffffffb90;
  SourceLocation in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  DiagCode code;
  ImplicitAnsiPortSyntax *in_stack_fffffffffffffdd0;
  AnsiPortListBuilder *in_stack_fffffffffffffdd8;
  Token local_e0;
  SourceLocation local_d0;
  undefined4 local_c4;
  Symbol *local_c0;
  Symbol *local_b8;
  MemberSyntax *local_b0;
  const_iterator local_a8;
  const_iterator local_98;
  SeparatedSyntaxList<slang::syntax::MemberSyntax> *local_88;
  NonAnsiPortListBuilder *local_28;
  SyntaxNode *local_18;
  span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
  local_10;
  
  local_18 = in_RDI;
  if (in_RDI->kind == AnsiPortList) {
    anon_unknown_0::AnsiPortListBuilder::AnsiPortListBuilder
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
               (SmallVectorBase<std::pair<slang::ast::Symbol_*,_const_slang::ast::Symbol_*>_> *)
               in_stack_fffffffffffffaf0);
    pAVar3 = slang::syntax::SyntaxNode::as<slang::syntax::AnsiPortListSyntax>(local_18);
    local_88 = &pAVar3->ports;
    local_98 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x6b83b0);
    local_a8 = slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::end
                         ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)0x6b83cd);
    while( true ) {
      bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<const_slang::syntax::MemberSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      code = SUB84((ulong)in_stack_fffffffffffffba0 >> 0x20,0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_b0 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<const_slang::syntax::MemberSyntax_*>,_false>
                 ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<const_slang::syntax::MemberSyntax_*>,_false>
                              *)0x6b840a);
      if ((local_b0->super_SyntaxNode).kind == ExplicitAnsiPort) {
        slang::syntax::SyntaxNode::as<slang::syntax::ExplicitAnsiPortSyntax>
                  (&local_b0->super_SyntaxNode);
        local_c0 = anon_unknown_0::AnsiPortListBuilder::createPort
                             (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffaf0,
                   (Symbol **)in_stack_fffffffffffffae8);
      }
      else {
        slang::syntax::SyntaxNode::as<slang::syntax::ImplicitAnsiPortSyntax>
                  (&local_b0->super_SyntaxNode);
        local_b8 = anon_unknown_0::AnsiPortListBuilder::createPort
                             (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffaf0,
                   (Symbol **)in_stack_fffffffffffffae8);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<const_slang::syntax::MemberSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<const_slang::syntax::MemberSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::iterator_base<const_slang::syntax::MemberSyntax_*>,_false>
                  *)in_stack_fffffffffffffaf0);
    }
    bVar1 = std::
            span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
            ::empty((span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
                     *)0x6b84de);
    if (!bVar1) {
      local_c4 = 0x9f0006;
      std::
      span<const_std::pair<const_slang::syntax::SyntaxNode_*,_const_slang::ast::Symbol_*>,_18446744073709551615UL>
      ::operator[](&local_10,0);
      local_e0 = slang::syntax::SyntaxNode::getFirstToken(in_stack_fffffffffffffb20);
      local_d0 = parsing::Token::location(&local_e0);
      Scope::addDiag(in_stack_fffffffffffffb90,code,in_stack_fffffffffffffb98);
    }
  }
  else {
    local_28 = in_RDX;
    anon_unknown_0::NonAnsiPortListBuilder::NonAnsiPortListBuilder
              (in_stack_00000050,in_stack_00000048,in_stack_00000058,in_stack_00000040);
    slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiPortListSyntax>(local_18);
    cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)0x6b85d3);
    this = (NonAnsiPortListBuilder *)cVar4.index;
    slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)0x6b860c);
    while (uVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>_>
                             ((self_type *)in_stack_fffffffffffffaf0,
                              (iterator_base<const_slang::syntax::NonAnsiPortSyntax_*> *)
                              in_stack_fffffffffffffae8), ((uVar2 ^ 0xff) & 1) != 0) {
      syntax_00 = (ExplicitNonAnsiPortSyntax *)
                  iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>,_false>
                               *)0x6b8669);
      SVar5 = (syntax_00->super_NonAnsiPortSyntax).super_SyntaxNode.kind;
      if (SVar5 == EmptyNonAnsiPort) {
        slang::syntax::SyntaxNode::as<slang::syntax::EmptyNonAnsiPortSyntax>
                  ((SyntaxNode *)syntax_00);
        in_stack_fffffffffffffaf0 =
             anon_unknown_0::NonAnsiPortListBuilder::createPort
                       (in_stack_fffffffffffffb10,
                        (EmptyNonAnsiPortSyntax *)in_stack_fffffffffffffb08);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffaf0,
                   (Symbol **)in_stack_fffffffffffffae8);
      }
      else if (SVar5 == ExplicitNonAnsiPort) {
        in_stack_fffffffffffffb10 = local_28;
        slang::syntax::SyntaxNode::as<slang::syntax::ExplicitNonAnsiPortSyntax>
                  ((SyntaxNode *)syntax_00);
        in_stack_fffffffffffffb08 =
             anon_unknown_0::NonAnsiPortListBuilder::createPort
                       ((NonAnsiPortListBuilder *)CONCAT17(uVar2,in_stack_fffffffffffffb48),
                        syntax_00);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffaf0,
                   (Symbol **)in_stack_fffffffffffffae8);
      }
      else {
        syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicitNonAnsiPortSyntax>
                              ((SyntaxNode *)syntax_00);
        anon_unknown_0::NonAnsiPortListBuilder::createPort
                  ((NonAnsiPortListBuilder *)CONCAT44(SVar5,in_stack_fffffffffffffb38),syntax_01);
        SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffaf0,
                   (Symbol **)in_stack_fffffffffffffae8);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::iterator_base<const_slang::syntax::NonAnsiPortSyntax_*>,_false>
                  *)in_stack_fffffffffffffaf0);
    }
    anon_unknown_0::NonAnsiPortListBuilder::finalize(this);
    anon_unknown_0::NonAnsiPortListBuilder::~NonAnsiPortListBuilder
              ((NonAnsiPortListBuilder *)0x6b881d);
  }
  return;
}

Assistant:

void PortSymbol::fromSyntax(
    const PortListSyntax& syntax, const Scope& scope, SmallVectorBase<const Symbol*>& results,
    SmallVectorBase<std::pair<Symbol*, const Symbol*>>& implicitMembers,
    std::span<std::pair<const SyntaxNode*, const Symbol*> const> portDeclarations) {

    switch (syntax.kind) {
        case SyntaxKind::AnsiPortList: {
            AnsiPortListBuilder builder{scope, implicitMembers};
            for (auto port : syntax.as<AnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ImplicitAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitAnsiPort:
                        results.push_back(builder.createPort(port->as<ExplicitAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }

            if (!portDeclarations.empty()) {
                scope.addDiag(diag::PortDeclInANSIModule,
                              portDeclarations[0].first->getFirstToken().location());
            }
            break;
        }
        case SyntaxKind::NonAnsiPortList: {
            NonAnsiPortListBuilder builder{scope, portDeclarations, implicitMembers};
            for (auto port : syntax.as<NonAnsiPortListSyntax>().ports) {
                switch (port->kind) {
                    case SyntaxKind::ImplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ImplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::ExplicitNonAnsiPort:
                        results.push_back(
                            builder.createPort(port->as<ExplicitNonAnsiPortSyntax>()));
                        break;
                    case SyntaxKind::EmptyNonAnsiPort:
                        results.push_back(builder.createPort(port->as<EmptyNonAnsiPortSyntax>()));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            builder.finalize();
            break;
        }
        default:
            SLANG_UNREACHABLE;
    }
}